

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O1

TPM_RC TSS_HMAC(TSS_DEVICE *tpm,TSS_SESSION *session,TPMI_DH_OBJECT handle,BYTE *data,
               UINT32 dataSize,TPM2B_DIGEST *outHMAC)

{
  TPM_RC TVar1;
  LOGGER_LOG p_Var2;
  TPM2B_MAX_BUFFER dataBuf;
  
  if (dataSize < 0x401) {
    if ((data == (BYTE *)0x0 || (session == (TSS_SESSION *)0x0 || tpm == (TSS_DEVICE *)0x0)) ||
        outHMAC == (TPM2B_DIGEST *)0x0) {
      p_Var2 = xlogging_get_log_function();
      TVar1 = 0x101;
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
                  ,"TSS_HMAC",0x1b5,1,
                  "Invalid parameter specified tpm: %p, session: %p, data: %p, outHMAC: %p",tpm,
                  session,data,outHMAC);
      }
    }
    else {
      dataBuf.t.size = (UINT16)dataSize;
      MemoryCopy(dataBuf.t.buffer,data,dataSize);
      TVar1 = TPM2_HMAC(tpm,session,handle,&dataBuf,0x10,outHMAC);
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    TVar1 = 0x95;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
                ,"TSS_HMAC",0x1b0,1,"Invalid data size specified %u",(ulong)dataSize);
    }
  }
  return TVar1;
}

Assistant:

TPM_RC TSS_HMAC(
    TSS_DEVICE             *tpm,                // IN/OUT
    TSS_SESSION            *session,            // IN/OUT
    TPMI_DH_OBJECT          handle,             // IN
    BYTE                   *data,               // IN
    UINT32                  dataSize,           // IN
    TPM2B_DIGEST           *outHMAC             // OUT
)
{
    TPM_RC result;
    if (dataSize > MAX_DIGEST_BUFFER)
    {
        LogError("Invalid data size specified %u", dataSize);
        result = TPM_RC_SIZE;
    }
    else if (tpm == NULL || session == NULL || data == NULL || outHMAC == NULL)
    {
        LogError("Invalid parameter specified tpm: %p, session: %p, data: %p, outHMAC: %p", tpm, session, data, outHMAC);
        result = TPM_RC_FAILURE;
    }
    else
    {
        TPM2B_MAX_BUFFER    dataBuf;
        dataBuf.b.size = (UINT16)dataSize;
        MemoryCopy(dataBuf.t.buffer, data, dataSize);
        result = TPM2_HMAC(tpm, session, handle, &dataBuf, TPM_ALG_NULL, outHMAC);
    }
    return result;
}